

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint16_t * __thiscall
icu_63::Normalizer2Impl::getCompositionsListForDecompYes(Normalizer2Impl *this,uint16_t norm16)

{
  if ((ushort)(norm16 + 0x400) < 0x402) {
    return (uint16_t *)0x0;
  }
  if (norm16 < this->minMaybeYes) {
    return (uint16_t *)((ulong)(norm16 & 0xfffe) + (long)this->extraData);
  }
  return (uint16_t *)
         ((long)this->maybeYesCompositions +
         ((ulong)norm16 * 2 - (ulong)((uint)this->minMaybeYes * 2)));
}

Assistant:

const uint16_t *getCompositionsListForDecompYes(uint16_t norm16) const {
        if(norm16<JAMO_L || MIN_NORMAL_MAYBE_YES<=norm16) {
            return NULL;
        } else if(norm16<minMaybeYes) {
            return getMapping(norm16);  // for yesYes; if Jamo L: harmless empty list
        } else {
            return maybeYesCompositions+norm16-minMaybeYes;
        }
    }